

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.h
# Opt level: O1

bool google::protobuf::internal::
     HandleString<google::protobuf::internal::(anonymous_namespace)::UnknownFieldHandlerLite,(google::protobuf::internal::Cardinality)0,false,(google::protobuf::internal::StringType)3>
               (CodedInputStream *input,MessageLite *msg,Arena *arena,uint32 *has_bits,
               uint32 has_bit_index,int64 offset,void *default_ptr,char *field_name)

{
  size_t size;
  bool bVar1;
  LogMessage *pLVar2;
  string *value;
  undefined4 in_register_00000084;
  LogMessage local_b0;
  LogMessage local_78;
  CodedInputStream *local_40;
  LogFinisher local_31;
  
  if (arena == (Arena *)0x0) {
    local_40 = input;
    LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_table_driven_lite.h"
               ,0x76);
    pLVar2 = LogMessage::operator<<(&local_b0,"CHECK failed: has_bits != nullptr: ");
    LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
    LogMessage::~LogMessage(&local_b0);
    input = local_40;
  }
  *(uint *)(arena + ((ulong)has_bits >> 5 & 0x7ffffff) * 4) =
       *(uint *)(arena + ((ulong)has_bits >> 5 & 0x7ffffff) * 4) | 1 << ((byte)has_bits & 0x1f);
  if (msg == (MessageLite *)0x0) {
    LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/generated_message_table_driven_lite.h"
               ,0xf4);
    pLVar2 = LogMessage::operator<<(&local_78,"CHECK failed: s != nullptr: ");
    LogFinisher::operator=(&local_31,pLVar2);
    LogMessage::~LogMessage(&local_78);
  }
  value = (string *)((long)&msg->_vptr_MessageLite + CONCAT44(in_register_00000084,has_bit_index));
  bVar1 = WireFormatLite::ReadBytes(input,value);
  if ((bVar1) && (size = value->_M_string_length, (long)size < 0)) {
    StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
  }
  return bVar1;
}

Assistant:

static inline bool HandleString(io::CodedInputStream* input, MessageLite* msg,
                                Arena* arena, uint32* has_bits,
                                uint32 has_bit_index, int64 offset,
                                const void* default_ptr,
                                const char* field_name) {
  StringPiece utf8_string_data;
#ifdef GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
  constexpr bool kValidateUtf8 = is_string_type;
#else
  constexpr bool kValidateUtf8 = false;
#endif  // GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED

  switch (ctype) {
    case StringType_INLINED: {
      InlinedStringField* s = nullptr;
      switch (cardinality) {
        case Cardinality_SINGULAR:
          // TODO(ckennelly): Is this optimal?
          s = MutableField<InlinedStringField>(msg, has_bits, has_bit_index,
                                               offset);
          break;
        case Cardinality_REPEATED:
          s = AddField<InlinedStringField>(msg, offset);
          break;
        case Cardinality_ONEOF:
          s = Raw<InlinedStringField>(msg, offset);
          break;
      }
      GOOGLE_DCHECK(s != nullptr);
      std::string* value = s->MutableNoArena(NULL);
      if (PROTOBUF_PREDICT_FALSE(!WireFormatLite::ReadString(input, value))) {
        return false;
      }
      utf8_string_data = *value;
      break;
    }
    case StringType_STRING: {
      switch (cardinality) {
        case Cardinality_SINGULAR: {
          ArenaStringPtr* field = MutableField<ArenaStringPtr>(
              msg, has_bits, has_bit_index, offset);
          std::string* value = field->Mutable(
              static_cast<const std::string*>(default_ptr), arena);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = field->Get();
        } break;
        case Cardinality_REPEATED: {
          std::string* value = AddField<std::string>(msg, offset);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = *value;
        } break;
        case Cardinality_ONEOF: {
          ArenaStringPtr* field = Raw<ArenaStringPtr>(msg, offset);
          std::string* value = field->Mutable(
              static_cast<const std::string*>(default_ptr), arena);
          if (PROTOBUF_PREDICT_FALSE(
                  !WireFormatLite::ReadString(input, value))) {
            return false;
          }
          utf8_string_data = field->Get();
        } break;
        default:
          PROTOBUF_ASSUME(false);
      }
      break;
    }
    default:
      PROTOBUF_ASSUME(false);
  }

  if (kValidateUtf8) {
    // TODO(b/118759213): fail if proto3
    WireFormatLite::VerifyUtf8String(utf8_string_data.data(),
                                     utf8_string_data.length(),
                                     WireFormatLite::PARSE, field_name);
  }
  return true;
}